

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update3sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double eps3,
          double *vec3,int *idx3,double *rhs3,int *ridx3,int *rn3,double *forest,int *forestNum,
          int *forestIdx)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  vSolveLright3(this,rhs,ridx,rn,eps,rhs2,ridx2,rn2,eps2,rhs3,ridx3,rn3,eps3);
  piVar3 = (this->row).perm;
  if (forest == (double *)0x0) {
    if (*rn < 1) {
      iVar5 = 0;
    }
    else {
      lVar9 = 0;
      uVar8 = 0;
      do {
        uVar4 = (uint)uVar8;
        iVar5 = ridx[lVar9];
        if (ABS(rhs[iVar5]) <= eps) {
          rhs[iVar5] = 0.0;
        }
        else {
          iVar5 = piVar3[iVar5];
          uVar7 = uVar4;
          if (0 < (int)uVar4) {
            do {
              uVar10 = (uint)uVar8 - 1;
              uVar6 = uVar10 >> 1;
              uVar7 = (uint)uVar8;
              if (iVar5 <= ridx[uVar6]) break;
              ridx[uVar8] = ridx[uVar6];
              uVar8 = (ulong)uVar6;
              uVar7 = uVar6;
            } while (1 < uVar10);
          }
          uVar8 = (ulong)(uVar4 + 1);
          ridx[(int)uVar7] = iVar5;
        }
        iVar5 = (int)uVar8;
        lVar9 = lVar9 + 1;
      } while (lVar9 < *rn);
    }
    *rn = iVar5;
  }
  else {
    if (*rn < 1) {
      uVar4 = 0;
    }
    else {
      lVar9 = 0;
      uVar4 = 0;
      do {
        iVar5 = ridx[lVar9];
        dVar1 = rhs[iVar5];
        if (ABS(dVar1) <= eps) {
          rhs[iVar5] = 0.0;
        }
        else {
          *forestIdx = iVar5;
          iVar2 = piVar3[iVar5];
          uVar7 = uVar4;
          if (0 < (int)uVar4) {
            do {
              uVar6 = uVar7 - 1;
              uVar10 = uVar6 >> 1;
              if (iVar2 <= ridx[uVar10]) break;
              ridx[uVar7] = ridx[uVar10];
              uVar7 = uVar10;
            } while (1 < uVar6);
          }
          forestIdx = forestIdx + 1;
          uVar4 = uVar4 + 1;
          ridx[(int)uVar7] = iVar2;
          forest[iVar5] = dVar1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < *rn);
    }
    *rn = uVar4;
    *forestNum = uVar4;
  }
  uVar7 = 0;
  uVar4 = 0;
  if (0 < *rn2) {
    lVar9 = 0;
    uVar4 = 0;
    do {
      iVar5 = ridx2[lVar9];
      if (ABS(rhs2[iVar5]) <= eps2) {
        rhs2[iVar5] = 0.0;
      }
      else {
        iVar5 = piVar3[iVar5];
        uVar6 = uVar4;
        if (0 < (int)uVar4) {
          do {
            uVar11 = uVar6 - 1;
            uVar10 = uVar11 >> 1;
            if (iVar5 <= ridx2[uVar10]) break;
            ridx2[uVar6] = ridx2[uVar10];
            uVar6 = uVar10;
          } while (1 < uVar11);
        }
        uVar4 = uVar4 + 1;
        ridx2[(int)uVar6] = iVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *rn2);
  }
  *rn2 = uVar4;
  if (0 < *rn3) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      iVar5 = ridx3[lVar9];
      if (ABS(rhs3[iVar5]) <= eps3) {
        rhs3[iVar5] = 0.0;
      }
      else {
        iVar5 = piVar3[iVar5];
        uVar4 = uVar7;
        if (0 < (int)uVar7) {
          do {
            uVar10 = uVar4 - 1;
            uVar6 = uVar10 >> 1;
            if (iVar5 <= ridx3[uVar6]) break;
            ridx3[uVar4] = ridx3[uVar6];
            uVar4 = uVar6;
          } while (1 < uVar10);
        }
        uVar7 = uVar7 + 1;
        ridx3[(int)uVar4] = iVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *rn3);
  }
  *rn3 = uVar7;
  iVar5 = vSolveUright(this,vec,idx,rhs,ridx,*rn,eps);
  *rn = iVar5;
  iVar5 = vSolveUright(this,vec2,idx2,rhs2,ridx2,*rn2,eps2);
  *rn2 = iVar5;
  iVar5 = vSolveUright(this,vec3,idx3,rhs3,ridx3,*rn3,eps3);
  *rn3 = iVar5;
  if ((this->l).updateType == 0) {
    iVar5 = vSolveUpdateRight(this,vec,idx,*rn,eps);
    *rn = iVar5;
    iVar5 = vSolveUpdateRight(this,vec2,idx2,*rn2,eps2);
    *rn2 = iVar5;
    iVar5 = vSolveUpdateRight(this,vec3,idx3,*rn3,eps3);
    *rn3 = iVar5;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}